

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O2

void drowning_tick(CHAR_DATA *ch,AFFECT_DATA *af)

{
  bool bVar1;
  char *dnoun;
  int idam;
  
  bVar1 = is_affected_room(ch->in_room,(int)gsn_airy_water);
  if (((bVar1) || (ch->in_room->sector_type != 8)) &&
     (bVar1 = is_affected(ch,(int)gsn_drowning), bVar1)) {
    switchD_00333f01::default(ch,(int)gsn_drowning);
    return;
  }
  bVar1 = is_immortal(ch);
  if (!bVar1) {
    switch(af->duration) {
    case 0:
      act("You drift into unconsciousness, and a sea of blackness swiftly overtakes you.",ch,
          (void *)0x0,(void *)0x0,3);
      raw_kill(ch,ch);
      return;
    case 1:
    case 2:
      act("Gasping involuntarily, you take huge amounts of water into your lungs!",ch,(void *)0x0,
          (void *)0x0,3);
      idam = (ch->max_hit / 100) * 0x4b;
      dnoun = "drowning";
      break;
    case 3:
      act("Your heart leaps in your chest, protesting the lack of oxygen!",ch,(void *)0x0,
          (void *)0x0,3);
      idam = (int)(short)((ch->max_hit / 100) * 0x19);
      dnoun = "asphyxiation";
      break;
    case 4:
      act("Your face grows a deeper shade of red as you struggle to hold your breath!",ch,
          (void *)0x0,(void *)0x0,3);
      act("$n\'s face grows a deeper shade of red as $e struggles to hold $s breath!",ch,(void *)0x0
          ,(void *)0x0,0);
      return;
    default:
      goto switchD_002b0d6f_default;
    }
    damage_new(ch,ch,idam,(int)gsn_drowning,0xe,true,false,0,1,dnoun);
  }
switchD_002b0d6f_default:
  return;
}

Assistant:

void drowning_tick(CHAR_DATA *ch, AFFECT_DATA *af)
{
	if ((is_affected_room(ch->in_room, gsn_airy_water) || ch->in_room->sector_type != SECT_UNDERWATER)
		&& is_affected(ch, gsn_drowning))
	{
		affect_strip(ch, gsn_drowning);
		return;
	}

	if (is_immortal(ch))
		return;

	switch (af->duration)
	{
		case 0:
			act("You drift into unconsciousness, and a sea of blackness swiftly overtakes you.", ch, 0, 0, TO_CHAR);
			raw_kill(ch, ch);
			break;
		case 1:
		case 2:
			act("Gasping involuntarily, you take huge amounts of water into your lungs!", ch, 0, 0, TO_CHAR);
			damage_new(ch, ch, (int)((ch->max_hit / 100) * 75), gsn_drowning, DAM_DROWNING, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "drowning");
			break;
		case 3:
			act("Your heart leaps in your chest, protesting the lack of oxygen!", ch, 0, 0, TO_CHAR);
			damage_new(ch, ch, (int)((ch->max_hit / 100) * 25), gsn_drowning, DAM_DROWNING, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "asphyxiation");
			break;
		case 4:
			act("Your face grows a deeper shade of red as you struggle to hold your breath!", ch, 0, 0, TO_CHAR);
			act("$n's face grows a deeper shade of red as $e struggles to hold $s breath!", ch, 0, 0, TO_ROOM);
			break;
	}
}